

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.cpp
# Opt level: O3

bool __thiscall ser::MetainfoSet::AsBool(MetainfoSet *this,string *key)

{
  char *__s1;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  const_iterator cVar4;
  undefined *puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  bool *pbVar7;
  int *piVar8;
  float *pfVar9;
  double *pdVar10;
  ostream *poVar11;
  _Base_ptr operand;
  undefined1 uVar12;
  bool v;
  stringstream ss;
  undefined1 local_1c1;
  char *local_1c0;
  long local_1b8;
  char local_1b0 [16];
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  cVar4 = checkKeyExists(this,key);
  if (*(long **)(cVar4._M_node + 2) == (long *)0x0) {
    puVar5 = &void::typeinfo;
  }
  else {
    puVar5 = (undefined *)(**(code **)(**(long **)(cVar4._M_node + 2) + 0x10))();
  }
  operand = cVar4._M_node + 2;
  __s1 = *(char **)(puVar5 + 8);
  if (__s1 == _ofstream) {
LAB_0011f321:
    pbVar7 = boost::any_cast<bool_const&>((any *)operand);
    uVar12 = *pbVar7;
  }
  else {
    if (*__s1 == '*') {
      if (__s1 != _put) {
        if (__s1 == ___throw_out_of_range_fmt) {
LAB_0011f33d:
          pfVar9 = boost::any_cast<float_const&>((any *)operand);
          bVar2 = *pfVar9 != 0.0;
          goto LAB_0011f369;
        }
        if (__s1 != __M_extract<float>) {
          if (__s1 != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") {
LAB_0011f37b:
            poVar11 = std::operator<<((ostream *)&std::cerr,"Bug in MetainfoSet: type of \'");
            poVar11 = std::operator<<(poVar11,(string *)key);
            std::operator<<(poVar11,"\' not recognized\n");
            exit(1);
          }
LAB_0011f29c:
          std::__cxx11::stringstream::stringstream(local_1a0);
          pbVar6 = boost::any_cast<std::__cxx11::string_const&>((any *)operand);
          pcVar1 = (pbVar6->_M_dataplus)._M_p;
          local_1c0 = local_1b0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1c0,pcVar1,pcVar1 + pbVar6->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(local_190,local_1c0,local_1b8);
          if (local_1c0 != local_1b0) {
            operator_delete(local_1c0);
          }
          std::istream::_M_extract<bool>((bool *)local_1a0);
          std::__cxx11::stringstream::~stringstream(local_1a0);
          std::ios_base::~ios_base(local_120);
          return (bool)local_1c1;
        }
LAB_0011f353:
        pdVar10 = boost::any_cast<double_const&>((any *)operand);
        bVar2 = *pdVar10 != 0.0;
LAB_0011f369:
        return (bool)(-bVar2 & 1);
      }
    }
    else {
      iVar3 = strcmp(__s1,_ofstream);
      if (iVar3 == 0) goto LAB_0011f321;
      if ((__s1 != _put) && (iVar3 = strcmp(__s1,_put), iVar3 != 0)) {
        if ((__s1 == ___throw_out_of_range_fmt) ||
           (iVar3 = strcmp(__s1,___throw_out_of_range_fmt), iVar3 == 0)) goto LAB_0011f33d;
        if ((__s1 != __M_extract<float>) && (iVar3 = strcmp(__s1,__M_extract<float>), iVar3 != 0)) {
          if ((__s1 != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") &&
             (iVar3 = strcmp(__s1,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE"),
             iVar3 != 0)) goto LAB_0011f37b;
          goto LAB_0011f29c;
        }
        goto LAB_0011f353;
      }
    }
    piVar8 = boost::any_cast<int_const&>((any *)operand);
    uVar12 = *piVar8 != 0;
  }
  return (bool)uVar12;
}

Assistant:

bool MetainfoSet::AsBool(const std::string& key) const
{
    std::map<std::string, boost::any>::const_iterator iter = checkKeyExists(key);
    const boost::any& a = iter->second;
    const std::type_info& t = a.type();

         if(t == typeid(bool)) return boost::any_cast<bool>(a);
    else if(t == typeid(int)) return (bool)boost::any_cast<int>(a);
    else if(t == typeid(float)) return (bool)boost::any_cast<float>(a);
    else if(t == typeid(double)) return (bool)boost::any_cast<double>(a);
    else if(t == typeid(std::string))
    {
        bool v;
        std::stringstream ss;
        ss << boost::any_cast<std::string>(a);
        ss >> v;
        return v;
    }

    // Reaching this point is a bug
    std::cerr << "Bug in MetainfoSet: type of '" << key << "' not recognized\n";
    std::exit(1);
    return true;
}